

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_name2id(bam_hdr_t *h,char *ref)

{
  khint_t kVar1;
  int iVar2;
  kh_s2i_t *h_00;
  long lVar3;
  int absent;
  int local_2c;
  
  h_00 = (kh_s2i_t *)h->sdict;
  if (h_00 == (kh_s2i_t *)0x0) {
    h_00 = kh_init_s2i();
    if (0 < h->n_targets) {
      lVar3 = 0;
      do {
        kVar1 = kh_put_s2i(h_00,h->target_name[lVar3],&local_2c);
        h_00->vals[kVar1] = lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 < h->n_targets);
    }
    h->sdict = h_00;
  }
  kVar1 = kh_get_s2i(h_00,ref);
  iVar2 = -1;
  if (kVar1 != h_00->n_buckets) {
    iVar2 = (int)h_00->vals[kVar1];
  }
  return iVar2;
}

Assistant:

int bam_name2id(bam_hdr_t *h, const char *ref)
{
    sdict_t *d = (sdict_t*)h->sdict;
    khint_t k;
    if (h->sdict == 0) {
        int i, absent;
        d = kh_init(s2i);
        for (i = 0; i < h->n_targets; ++i) {
            k = kh_put(s2i, d, h->target_name[i], &absent);
            kh_val(d, k) = i;
        }
        h->sdict = d;
    }
    k = kh_get(s2i, d, ref);
    return k == kh_end(d)? -1 : kh_val(d, k);
}